

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O0

size_t __thiscall CodegenC::FunctionTable::look_up(FunctionTable *this,Function *function)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  size_t index;
  _Self local_28;
  iterator iterator;
  Function *function_local;
  FunctionTable *this_local;
  
  iterator._M_node = (_Base_ptr)function;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
       ::find(&this->functions,(key_type *)&iterator);
  index = (size_t)std::
                  map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
                  ::end(&this->functions);
  bVar1 = std::operator!=(&local_28,(_Self *)&index);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Function_*const,_unsigned_long>_>::operator->
                       (&local_28);
    this_local = (FunctionTable *)ppVar2->second;
  }
  else {
    this_local = (FunctionTable *)
                 std::
                 map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
                 ::size(&this->functions);
    pmVar3 = std::
             map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
             ::operator[](&this->functions,(key_type *)&iterator);
    *pmVar3 = (mapped_type)this_local;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t look_up(const Function* function) {
			auto iterator = functions.find(function);
			if (iterator != functions.end()) {
				return iterator->second;
			}
			const std::size_t index = functions.size();
			functions[function] = index;
			return index;
		}